

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

int arti_invoke(obj *obj)

{
  char cVar1;
  uint uVar2;
  schar sVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong xtime;
  obj *poVar10;
  bool bVar11;
  int local_11c;
  artifact *local_f8;
  boolean on;
  long iprop;
  long eprop;
  obj *otmp_1;
  int selected [1];
  int n;
  nh_menuitem *items;
  int local_b8;
  int iStack_b4;
  d_level newlev;
  int last_ok_dungeon;
  int num_ok_dungeons;
  int i;
  boolean b_effect;
  obj *otmp;
  int epboost;
  long creamed;
  int healamt;
  boolean unused_known;
  obj pseudo;
  artifact *oart;
  obj *obj_local;
  
  uVar6 = moves;
  if ((obj == (obj *)0x0) || (obj->oartifact == '\0')) {
    local_f8 = (artifact *)0x0;
  }
  else {
    local_f8 = artilist + (int)obj->oartifact;
  }
  pseudo._96_8_ = local_f8;
  if ((local_f8 == (artifact *)0x0) || (local_f8->inv_prop == '\0')) {
    if (obj->oclass == '\v') {
      iVar5 = do_break_wand(obj);
      return iVar5;
    }
    if ((obj->oclass != '\r') && (obj->oclass != '\x06')) {
      if (obj->otyp == 0xec) {
        use_crystal_ball(obj);
      }
      else {
        if ((obj->otyp == 0xd9) || (obj->otyp == 0xd8)) {
          iVar5 = invoke_amulet(obj);
          return iVar5;
        }
        pline("Nothing happens.");
      }
      return 1;
    }
    iVar5 = dorub(obj);
    return iVar5;
  }
  if (local_f8->inv_prop < 0x43) {
    uVar7 = u.uprops[local_f8->inv_prop].extrinsic ^ 0x2000;
    u.uprops[local_f8->inv_prop].extrinsic = uVar7;
    uVar2 = moves;
    uVar6 = u.uprops[local_f8->inv_prop].intrinsic;
    bVar11 = (uVar7 & 0x2000) != 0;
    if ((bVar11) && (moves < (uint)obj->age)) {
      u.uprops[local_f8->inv_prop].extrinsic = u.uprops[local_f8->inv_prop].extrinsic ^ 0x2000;
      pcVar8 = xname(obj);
      pcVar8 = the(pcVar8);
      pcVar9 = otense(obj,"are");
      pline("You feel that %s %s ignoring you.",pcVar8,pcVar9);
      iVar5 = dice(3,10);
      obj->age = obj->age + iVar5;
      return 1;
    }
    if (!bVar11) {
      iVar5 = rnz(100);
      obj->age = uVar2 + iVar5;
    }
    if (((uVar7 & 0xffffdfff) != 0) || (uVar6 != 0)) goto LAB_001582de;
    cVar1 = *(char *)(pseudo._96_8_ + 0x35);
    if (cVar1 == '\r') {
      if ((u.uprops[0xd].blocked != 0) ||
         (((u.uprops[0x1e].intrinsic != 0 ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))))) goto LAB_001582de;
      newsym((int)u.ux,(int)u.uy);
      if (bVar11) {
        bVar11 = false;
        if (u.uprops[0x23].intrinsic != 0) {
          bVar11 = true;
          if ((u.uprops[0x24].extrinsic == 0) && (bVar11 = false, u.umonnum != u.umonster)) {
            bVar4 = dmgtype(youmonst.data,0x24);
            bVar11 = bVar4 != '\0';
          }
          bVar11 = (bool)(bVar11 ^ 1);
        }
        pcVar8 = "strange";
        if (bVar11) {
          pcVar8 = "normal";
        }
        pline("Your body takes on a %s transparency...",pcVar8);
      }
      else {
        pline("Your body seems to unfade...");
      }
    }
    else if (cVar1 == '\x12') {
      if (bVar11) {
        float_up();
        spoteffects('\0');
      }
      else {
        float_down(0x10ffffff,0x2000);
      }
    }
    else if (cVar1 == '\x15') {
      if (bVar11) {
        pline("You feel like a rabble-rouser.");
      }
      else {
        pline("You feel the tension decrease around you.");
      }
    }
  }
  else {
    if (moves < (uint)obj->age) {
      pcVar8 = xname(obj);
      pcVar8 = the(pcVar8);
      pcVar9 = otense(obj,"are");
      pline("You feel that %s %s ignoring you.",pcVar8,pcVar9);
      iVar5 = dice(3,10);
      obj->age = obj->age + iVar5;
      return 1;
    }
    iVar5 = rnz(100);
    obj->age = uVar6 + iVar5;
    switch(*(undefined1 *)(pseudo._96_8_ + 0x35)) {
    case 0x43:
      memcpy(&healamt,&zeroobj,0x68);
      pseudo.olev._2_2_ = 0x159;
      seffects((obj *)&healamt,(boolean *)((long)&creamed + 7));
      break;
    case 0x44:
      iVar5 = (u.uhpmax + 1) - u.uhp;
      xtime = (ulong)u.ucreamed;
      if (u.umonnum != u.umonster) {
        iVar5 = (u.mhmax + 1) - u.mh;
      }
      creamed._0_4_ = iVar5 / 2;
      if (((((int)creamed == 0) && (u.uprops[0x1d].intrinsic == 0)) &&
          (u.uprops[0x3a].intrinsic == 0)) && (u.uprops[0x1e].intrinsic <= xtime)) {
LAB_001582de:
        if (obj->where == '\x03') {
          pline("You feel a surge of power, but nothing seems to happen.");
        }
        return 1;
      }
      pline("You feel better.");
      if (0 < (int)creamed) {
        if (u.umonnum == u.umonster) {
          u.uhp = (int)creamed + u.uhp;
        }
        else {
          u.mh = (int)creamed + u.mh;
        }
      }
      if (u.uprops[0x1d].intrinsic != 0) {
        make_sick(0,(char *)0x0,'\0',3);
      }
      if (u.uprops[0x3a].intrinsic != 0) {
        u.uprops[0x3a].intrinsic = 0;
      }
      if (xtime < u.uprops[0x1e].intrinsic) {
        make_blinded(xtime,'\0');
      }
      iflags.botl = '\x01';
      break;
    case 0x45:
      otmp._4_4_ = ((u.uenmax + 1) - u.uen) / 2;
      if (otmp._4_4_ < 0x79) {
        if (otmp._4_4_ < 0xc) {
          otmp._4_4_ = u.uenmax - u.uen;
        }
      }
      else {
        otmp._4_4_ = 0x78;
      }
      if (otmp._4_4_ == 0) goto LAB_001582de;
      pline("You feel re-energized.");
      u.uen = otmp._4_4_ + u.uen;
      iflags.botl = '\x01';
      break;
    case 0x46:
      iVar5 = untrap('\x01');
      if (iVar5 == 0) {
        obj->age = 0;
        return 0;
      }
      break;
    case 0x47:
      poVar10 = getobj("\x13\x14","charge",(obj **)0x0);
      if (poVar10 == (obj *)0x0) {
        obj->age = 0;
        return 0;
      }
      bVar11 = false;
      if (((*(uint *)&obj->field_0x4a >> 1 & 1) != 0) &&
         (bVar11 = true, urole.malenum != *(short *)(pseudo._96_8_ + 0x36))) {
        bVar11 = *(short *)(pseudo._96_8_ + 0x36) == 0;
      }
      if (bVar11) {
        local_11c = 1;
      }
      else {
        local_11c = 0;
        if ((*(uint *)&obj->field_0x4a & 1) != 0) {
          local_11c = -1;
        }
      }
      recharge(poVar10,local_11c);
      update_inventory();
      break;
    case 0x48:
      level_tele();
      break;
    case 0x49:
      local_b8 = 0;
      bVar4 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
      if ((bVar4 == '\0') || (u.ushops[0] == '\0')) {
        _selected = (nh_menuitem *)malloc((long)n_dgns * 0x10c);
        iStack_b4 = 0;
        for (last_ok_dungeon = 0; last_ok_dungeon < n_dgns; last_ok_dungeon = last_ok_dungeon + 1) {
          if (dungeons[last_ok_dungeon].dunlev_ureached != '\0') {
            _selected[iStack_b4].id = last_ok_dungeon + 1;
            _selected[iStack_b4].accel = '\0';
            _selected[iStack_b4].role = MI_NORMAL;
            _selected[iStack_b4].selected = '\0';
            strcpy(_selected[iStack_b4].caption,dungeons[last_ok_dungeon].dname);
            iStack_b4 = iStack_b4 + 1;
            local_b8 = last_ok_dungeon;
          }
        }
        if (iStack_b4 < 2) {
          free(_selected);
          last_ok_dungeon = local_b8;
        }
        else {
          otmp_1._4_4_ = display_menu(_selected,iStack_b4,"Open a portal to which dungeon?",1,
                                      (int *)&otmp_1);
          free(_selected);
          if (otmp_1._4_4_ < 1) goto LAB_001582de;
          last_ok_dungeon = (int)otmp_1 + -1;
        }
        items._6_1_ = (char)last_ok_dungeon;
        iVar5 = dungeons[last_ok_dungeon].depth_start;
        sVar3 = depth(&u.uz);
        if (iVar5 < sVar3) {
          items._7_1_ = dungeons[last_ok_dungeon].dunlev_ureached;
        }
        else {
          items._7_1_ = dungeons[last_ok_dungeon].entry_lev;
        }
        if (((((u.uhave._0_1_ & 1) == 0) && (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) &&
            (items._6_1_ != dungeon_topology.d_astral_level.dnum)) && (items._6_1_ != u.uz.dnum)) {
          if ((((u.uprops[0x1e].intrinsic == 0) &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            pline("You are surrounded by a shimmering sphere!");
          }
          else {
            pline("You feel weightless for a moment.");
          }
          goto_level((d_level *)((long)&items + 6),'\0','\0','\0');
        }
        else {
          pline("You feel very disoriented for a moment.");
        }
      }
      else {
        pline("You feel very disoriented for a moment.");
      }
      break;
    case 0x4a:
      enlightenment(0);
      break;
    case 0x4b:
      poVar10 = mksobj(level,1,'\x01','\0');
      if (poVar10 == (obj *)0x0) goto LAB_001582de;
      *(uint *)&poVar10->field_0x4a =
           *(uint *)&poVar10->field_0x4a & 0xfffffffd | (*(uint *)&obj->field_0x4a >> 1 & 1) << 1;
      *(uint *)&poVar10->field_0x4a =
           *(uint *)&poVar10->field_0x4a & 0xfffffffe | *(uint *)&obj->field_0x4a & 1;
      *(uint *)&poVar10->field_0x4a =
           *(uint *)&poVar10->field_0x4a & 0xffffffbf | (*(uint *)&obj->field_0x4a >> 6 & 1) << 6;
      if ((*(uint *)&obj->field_0x4a >> 1 & 1) == 0) {
        if ((*(uint *)&obj->field_0x4a & 1) == 0) {
          iVar5 = rnd(5);
          poVar10->quan = iVar5 + poVar10->quan;
        }
        else if ('\0' < poVar10->spe) {
          poVar10->spe = '\0';
        }
      }
      else {
        if (poVar10->spe < '\0') {
          poVar10->spe = '\0';
        }
        iVar5 = rnd(10);
        poVar10->quan = iVar5 + poVar10->quan;
      }
      uVar6 = weight(poVar10);
      poVar10->owt = uVar6;
      pcVar8 = aobjnam(poVar10,"fall");
      hold_another_object(poVar10,"Suddenly %s out.",pcVar8,(char *)0x0);
      break;
    case 0x4c:
      if (((u.uprops[0x3e].intrinsic != 0) || (u.uprops[0x3e].extrinsic != 0)) ||
         (((youmonst.data)->mflags1 & 8) != 0)) goto LAB_001582de;
      if ((artifact *)pseudo._96_8_ == artilist + 0x1a) {
        if ((uball != (obj *)0x0) && (obj != uball)) {
          pcVar8 = yname(uball);
          pline("You are liberated from %s!",pcVar8);
          unpunish();
        }
        if (uball == (obj *)0x0) {
          poVar10 = mkobj(level,'\x10','\x01');
          setworn(poVar10,0x400000);
          setworn(obj,0x200000);
          uball->spe = '\x01';
          if ((u._1052_1_ & 1) == 0) {
            placebc();
            if ((((u.uprops[0x1e].intrinsic != 0) ||
                 ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
               ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
              set_bc(1);
            }
            newsym((int)u.ux,(int)u.uy);
          }
          pcVar8 = xname(obj);
          pline("Your %s chains itself to you!",pcVar8);
        }
      }
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
        pline("Your body begins to feel less solid.");
      }
      else {
        pline("You feel one with the spirit world.");
      }
      iVar5 = rnd(100);
      incr_itimeout(&u.uprops[0x3e].intrinsic,(long)(iVar5 + 0x32));
      obj->age = u.uprops[0x3e].intrinsic + obj->age;
    }
  }
  return 1;
}

Assistant:

static int arti_invoke(struct obj *obj)
{
    const struct artifact *oart = get_artifact(obj);

    if (!oart || !oart->inv_prop) {
        if (obj->oclass == WAND_CLASS)
            return do_break_wand(obj);
        else if (obj->oclass == GEM_CLASS || obj->oclass == TOOL_CLASS)
            return dorub(obj);
	else if (obj->otyp == CRYSTAL_BALL)
	    use_crystal_ball(obj);
	else if (obj->otyp == AMULET_OF_YENDOR ||
		 obj->otyp == FAKE_AMULET_OF_YENDOR)
	    /* The Amulet is not technically an artifact
	     * in the usual sense... */
	    return invoke_amulet(obj);
	else
	    pline("Nothing happens.");
	return 1;
    }

    if (oart->inv_prop > LAST_PROP) {
	/* It's a special power, not "just" a property */
	if (obj->age > moves) {
	    /* the artifact is tired :-) */
	    pline("You feel that %s %s ignoring you.",
		     the(xname(obj)), otense(obj, "are"));
	    /* and just got more so; patience is essential... */
	    obj->age += (long) dice(3,10);
	    return 1;
	}
	obj->age = moves + rnz(100);

	switch(oart->inv_prop) {
	case TAMING: {
	    struct obj pseudo;
	    boolean unused_known;

	    pseudo = zeroobj;	/* neither cursed nor blessed */
	    pseudo.otyp = SCR_TAMING;
	    seffects(&pseudo, &unused_known);
	    break;
	  }
	case HEALING: {
	    int healamt = (u.uhpmax + 1 - u.uhp) / 2;
	    long creamed = (long)u.ucreamed;

	    if (Upolyd) healamt = (u.mhmax + 1 - u.mh) / 2;
	    if (healamt || Sick || Slimed || Blinded > creamed)
		pline("You feel better.");
	    else
		goto nothing_special;
	    if (healamt > 0) {
		if (Upolyd) u.mh += healamt;
		else u.uhp += healamt;
	    }
	    if (Sick) make_sick(0L,NULL,FALSE,SICK_ALL);
	    if (Slimed) Slimed = 0L;
	    if (Blinded > creamed) make_blinded(creamed, FALSE);
	    iflags.botl = 1;
	    break;
	  }
	case ENERGY_BOOST: {
	    int epboost = (u.uenmax + 1 - u.uen) / 2;
	    if (epboost > 120) epboost = 120;		/* arbitrary */
	    else if (epboost < 12) epboost = u.uenmax - u.uen;
	    if (epboost) {
		pline("You feel re-energized.");
		u.uen += epboost;
		iflags.botl = 1;
	    } else
		goto nothing_special;
	    break;
	  }
	case UNTRAP: {
	    if (!untrap(TRUE)) {
		obj->age = 0; /* don't charge for changing their mind */
		return 0;
	    }
	    break;
	  }
	case CHARGE_OBJ: {
	    struct obj *otmp = getobj(recharge_type, "charge", NULL);
	    boolean b_effect;

	    if (!otmp) {
		obj->age = 0;
		return 0;
	    }
	    b_effect = obj->blessed &&
		(Role_switch == oart->role || !oart->role);
	    recharge(otmp, b_effect ? 1 : obj->cursed ? -1 : 0);
	    update_inventory();
	    break;
	  }
	case LEV_TELE:
	    level_tele();
	    break;
	case CREATE_PORTAL: {
	    int i, num_ok_dungeons, last_ok_dungeon = 0;
	    d_level newlev;
	    extern int n_dgns; /* from dungeon.c */
	    struct nh_menuitem *items;

	    /* Prevent branchporting from the Black Market shop. */
	    if (Is_blackmarket(&u.uz) && *u.ushops) {
		pline("You feel very disoriented for a moment.");
		break;
	    }

	    items = malloc(n_dgns * sizeof(struct nh_menuitem));

	    num_ok_dungeons = 0;
	    for (i = 0; i < n_dgns; i++) {
		if (!dungeons[i].dunlev_ureached)
		    continue;
		items[num_ok_dungeons].id = i+1;
		items[num_ok_dungeons].accel = 0;
		items[num_ok_dungeons].role = MI_NORMAL;
		items[num_ok_dungeons].selected = FALSE;
		strcpy(items[num_ok_dungeons].caption, dungeons[i].dname);
		num_ok_dungeons++;
		last_ok_dungeon = i;
	    }

	    if (num_ok_dungeons > 1) {
		/* more than one entry; display menu for choices */
		int n;
		int selected[1];

		n = display_menu(items, num_ok_dungeons, "Open a portal to which dungeon?", PICK_ONE, selected);
		free(items);
		if (n <= 0)
		    goto nothing_special;
		
		i = selected[0] - 1;
	    } else {
		free(items);
		i = last_ok_dungeon;	/* also first & only OK dungeon */
	    }

	    /*
	     * i is now index into dungeon structure for the new dungeon.
	     * Find the closest level in the given dungeon, open
	     * a use-once portal to that dungeon and go there.
	     * The closest level is either the entry or dunlev_ureached.
	     */
	    newlev.dnum = i;
	    if (dungeons[i].depth_start >= depth(&u.uz))
		newlev.dlevel = dungeons[i].entry_lev;
	    else
		newlev.dlevel = dungeons[i].dunlev_ureached;
	    if (u.uhave.amulet || In_endgame(&u.uz) || In_endgame(&newlev) ||
	       newlev.dnum == u.uz.dnum) {
		pline("You feel very disoriented for a moment.");
	    } else {
		if (!Blind) pline("You are surrounded by a shimmering sphere!");
		else pline("You feel weightless for a moment.");
		goto_level(&newlev, FALSE, FALSE, FALSE);
	    }
	    break;
	  }
	case ENLIGHTENING:
	    enlightenment(0);
	    break;
	case CREATE_AMMO: {
	    struct obj *otmp = mksobj(level, ARROW, TRUE, FALSE);

	    if (!otmp) goto nothing_special;
	    otmp->blessed = obj->blessed;
	    otmp->cursed = obj->cursed;
	    otmp->bknown = obj->bknown;
	    if (obj->blessed) {
		if (otmp->spe < 0) otmp->spe = 0;
		otmp->quan += rnd(10);
	    } else if (obj->cursed) {
		if (otmp->spe > 0) otmp->spe = 0;
	    } else
		otmp->quan += rnd(5);
	    otmp->owt = weight(otmp);
	    hold_another_object(otmp, "Suddenly %s out.", aobjnam(otmp, "fall"), NULL);
	    break;
	  }
	case PHASING:	/* walk through walls and stone like a xorn */
	    if (Passes_walls) goto nothing_special;
	    if (oart == &artilist[ART_IRON_BALL_OF_LIBERATION]) {
		if (Punished && obj != uball) {
		    pline("You are liberated from %s!", yname(uball));
		    unpunish(); /* remove a mundane heavy iron ball */
		}

		if (!Punished) {
		    setworn(mkobj(level, CHAIN_CLASS, TRUE), W_CHAIN);
		    setworn(obj, W_BALL);
		    uball->spe = 1;	/* attach the Iron Ball of Liberation */
		    if (!u.uswallow) {
			placebc();
			if (Blind) set_bc(1);	/* set up ball and chain variables */
			newsym(u.ux, u.uy);	/* see ball&chain if can't see self */
		    }
		    pline("Your %s chains itself to you!", xname(obj));
		}
	    }
	    if (!Hallucination)
		pline("Your body begins to feel less solid.");
	    else
		pline("You feel one with the spirit world.");
	    incr_itimeout(&Phasing, (50 + rnd(100)));
	    obj->age += Phasing; /* Time begins after phasing ends */
	    break;
	}
    } else {
	long eprop = (u.uprops[oart->inv_prop].extrinsic ^= W_ARTI),
	     iprop = u.uprops[oart->inv_prop].intrinsic;
	boolean on = (eprop & W_ARTI) != 0; /* true if invoked prop just set */

	if (on && obj->age > moves) {
	    /* the artifact is tired :-) */
	    u.uprops[oart->inv_prop].extrinsic ^= W_ARTI;
	    pline("You feel that %s %s ignoring you.",
		     the(xname(obj)), otense(obj, "are"));
	    /* can't just keep repeatedly trying */
	    obj->age += (long) dice(3,10);
	    return 1;
	} else if (!on) {
	    /* when turning off property, determine downtime */
	    /* arbitrary for now until we can tune this -dlc */
	    obj->age = moves + rnz(100);
	}

	if ((eprop & ~W_ARTI) || iprop) {
nothing_special:
	    /* you had the property from some other source too */
	    if (carried(obj))
		pline("You feel a surge of power, but nothing seems to happen.");
	    return 1;
	}
	switch(oart->inv_prop) {
	case CONFLICT:
	    if (on) pline("You feel like a rabble-rouser.");
	    else pline("You feel the tension decrease around you.");
	    break;
	case LEVITATION:
	    if (on) {
		float_up();
		spoteffects(FALSE);
	    } else float_down(I_SPECIAL|TIMEOUT, W_ARTI);
	    break;
	case INVIS:
	    if (BInvis || Blind) goto nothing_special;
	    newsym(u.ux, u.uy);
	    if (on)
		pline("Your body takes on a %s transparency...",
		     Hallucination ? "normal" : "strange");
	    else
		pline("Your body seems to unfade...");
	    break;
	}
    }

    return 1;
}